

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::Span<QHashPrivate::Node<unsigned_long_long,_QSslServerPrivate::SocketData>_>::
moveFromSpan(Span<QHashPrivate::Node<unsigned_long_long,_QSslServerPrivate::SocketData>_> *this,
            Span<QHashPrivate::Node<unsigned_long_long,_QSslServerPrivate::SocketData>_> *fromSpan,
            size_t fromIndex,size_t to)

{
  uchar *puVar1;
  byte bVar2;
  byte bVar3;
  Entry *pEVar4;
  Entry *pEVar5;
  undefined8 uVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  Entry *pEVar7;
  uchar *this_01;
  uchar *this_02;
  
  if (this->nextFree == this->allocated) {
    addStorage(this);
  }
  this->offsets[to] = this->nextFree;
  pEVar4 = this->entries;
  bVar2 = this->nextFree;
  this->nextFree = pEVar4[bVar2].storage.data[0];
  bVar3 = fromSpan->offsets[fromIndex];
  fromSpan->offsets[fromIndex] = 0xff;
  pEVar5 = fromSpan->entries;
  *(undefined8 *)pEVar4[bVar2].storage.data = *(undefined8 *)pEVar5[bVar3].storage.data;
  this_01 = pEVar5[bVar3].storage.data + 8;
  this_01[0] = '\0';
  this_01[1] = '\0';
  this_01[2] = '\0';
  this_01[3] = '\0';
  this_01[4] = '\0';
  this_01[5] = '\0';
  this_01[6] = '\0';
  this_01[7] = '\0';
  *(undefined8 *)(pEVar4[bVar2].storage.data + 8) = *(undefined8 *)this_01;
  this_02 = pEVar5[bVar3].storage.data + 0x10;
  uVar6 = *(undefined8 *)(pEVar5[bVar3].storage.data + 0x18);
  this_02[0] = '\0';
  this_02[1] = '\0';
  this_02[2] = '\0';
  this_02[3] = '\0';
  this_02[4] = '\0';
  this_02[5] = '\0';
  this_02[6] = '\0';
  this_02[7] = '\0';
  puVar1 = pEVar4[bVar2].storage.data + 0x10;
  *(undefined8 *)puVar1 = *(undefined8 *)this_02;
  *(undefined8 *)(puVar1 + 8) = uVar6;
  pEVar7 = pEVar4 + bVar2;
  (pEVar7->storage).data[0x20] = '\0';
  (pEVar7->storage).data[0x21] = '\0';
  (pEVar7->storage).data[0x22] = '\0';
  (pEVar7->storage).data[0x23] = '\0';
  (pEVar7->storage).data[0x24] = '\0';
  (pEVar7->storage).data[0x25] = '\0';
  (pEVar7->storage).data[0x26] = '\0';
  (pEVar7->storage).data[0x27] = '\0';
  uVar6 = *(undefined8 *)(pEVar5[bVar3].storage.data + 0x20);
  pEVar7 = pEVar5 + bVar3;
  (pEVar7->storage).data[0x20] = '\0';
  (pEVar7->storage).data[0x21] = '\0';
  (pEVar7->storage).data[0x22] = '\0';
  (pEVar7->storage).data[0x23] = '\0';
  (pEVar7->storage).data[0x24] = '\0';
  (pEVar7->storage).data[0x25] = '\0';
  (pEVar7->storage).data[0x26] = '\0';
  (pEVar7->storage).data[0x27] = '\0';
  *(undefined8 *)(pEVar4[bVar2].storage.data + 0x20) = uVar6;
  pEVar4 = pEVar5 + bVar3;
  (pEVar4->storage).data[0x18] = '\0';
  (pEVar4->storage).data[0x19] = '\0';
  (pEVar4->storage).data[0x1a] = '\0';
  (pEVar4->storage).data[0x1b] = '\0';
  (pEVar4->storage).data[0x1c] = '\0';
  (pEVar4->storage).data[0x1d] = '\0';
  (pEVar4->storage).data[0x1e] = '\0';
  (pEVar4->storage).data[0x1f] = '\0';
  this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pEVar5[bVar3].storage.data + 0x20);
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  QMetaObject::Connection::~Connection((Connection *)this_02);
  QMetaObject::Connection::~Connection((Connection *)this_01);
  pEVar5[bVar3].storage.data[0] = fromSpan->nextFree;
  fromSpan->nextFree = bVar3;
  return;
}

Assistant:

void moveFromSpan(Span &fromSpan, size_t fromIndex, size_t to) noexcept(std::is_nothrow_move_constructible_v<Node>)
    {
        Q_ASSERT(to < SpanConstants::NEntries);
        Q_ASSERT(offsets[to] == SpanConstants::UnusedEntry);
        Q_ASSERT(fromIndex < SpanConstants::NEntries);
        Q_ASSERT(fromSpan.offsets[fromIndex] != SpanConstants::UnusedEntry);
        if (nextFree == allocated)
            addStorage();
        Q_ASSERT(nextFree < allocated);
        offsets[to] = nextFree;
        Entry &toEntry = entries[nextFree];
        nextFree = toEntry.nextFree();

        size_t fromOffset = fromSpan.offsets[fromIndex];
        fromSpan.offsets[fromIndex] = SpanConstants::UnusedEntry;
        Entry &fromEntry = fromSpan.entries[fromOffset];

        if constexpr (isRelocatable<Node>()) {
            memcpy(&toEntry, &fromEntry, sizeof(Entry));
        } else {
            new (&toEntry.node()) Node(std::move(fromEntry.node()));
            fromEntry.node().~Node();
        }
        fromEntry.nextFree() = fromSpan.nextFree;
        fromSpan.nextFree = static_cast<unsigned char>(fromOffset);
    }